

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  pointer piVar4;
  vector<int,_std::allocator<int>_> series;
  int n;
  char local_49;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"How many Fibonacci numbers needs to be found:\n",0x2e);
  local_2c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  calculateFibonacci(&local_48,local_2c);
  iVar2 = 0;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start <
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = 0;
    bVar3 = false;
    piVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if ((*piVar4 < 0) && (!bVar3)) {
        iVar2 = piVar4[-1];
        bVar3 = true;
      }
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
      local_49 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
      piVar4 = piVar4 + 1;
    } while (piVar4 < local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMax Fibonacci number that fits into 32 bit integer is: ",0x38)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	std::cout << "How many Fibonacci numbers needs to be found:\n";
	auto n = 0;
	std::cin >> n;
	auto series = calculateFibonacci(n);
	bool isNegativeNumFound = false;
	auto maxFibonacciThatFitsInInt = 0;
	for (auto it = series.begin(); it < series.end(); ++it)
	{
		if (*it < 0 && not isNegativeNumFound)
		{
			isNegativeNumFound = true;
			maxFibonacciThatFitsInInt = *(it - 1);
		}
		std::cout << *it << ' ';
	}
	std::cout << "\nMax Fibonacci number that fits into 32 bit integer is: "
			  << maxFibonacciThatFitsInInt << '\n';
	return 0;
}